

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

optional_ptr<duckdb::TemporaryFileHandle,_true> __thiscall
duckdb::TemporaryFileMap::GetFile(TemporaryFileMap *this,TemporaryFileIdentifier *identifier)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar1;
  optional_ptr<duckdb::TemporaryFileHandle,_true> oVar2;
  TemporaryBufferSize local_20;
  
  local_20 = identifier->size;
  this_00 = &::std::__detail::
             _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->files,&local_20)->_M_h;
  local_20 = optional_idx::GetIndex(&identifier->file_index);
  iVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    oVar2.ptr = (TemporaryFileHandle *)0x0;
  }
  else {
    oVar2.ptr = *(TemporaryFileHandle **)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
                        ._M_cur + 0x10);
  }
  return (optional_ptr<duckdb::TemporaryFileHandle,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<TemporaryFileHandle> TemporaryFileMap::GetFile(const TemporaryFileIdentifier &identifier) {
	D_ASSERT(identifier.IsValid());
	auto &map = GetMapForSize(identifier.size);
	const auto it = map.find(identifier.file_index.GetIndex());
	return it == map.end() ? nullptr : it->second.get();
}